

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CaseGenerateSyntax *pCVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  BumpAllocator *in_stack_00000018;
  BumpAllocator *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  Token *in_stack_00000038;
  BumpAllocator *in_stack_000000c8;
  Token *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  ExpressionSyntax *in_stack_ffffffffffffff80;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000030,in_stack_00000028);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x58c6da);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  deepClone<slang::syntax::CaseItemSyntax>
            ((SyntaxList<slang::syntax::CaseItemSyntax> *)in_stack_00000030,in_stack_00000028);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CaseGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>&,slang::parsing::Token>
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (ExpressionSyntax *)__fn,(Token *)__child_stack,
                      (SyntaxList<slang::syntax::CaseItemSyntax> *)in_stack_00000030,
                      in_stack_00000038);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CaseGenerateSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CaseGenerateSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.endCase.deepClone(alloc)
    );
}